

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_properties.c
# Opt level: O2

int mpt_message_property(mpt_message *msg,int sep,mpt_property_handler_t sfcn,void *spar)

{
  char cVar1;
  int iVar2;
  ulong len;
  undefined1 *puVar3;
  char *pcVar4;
  undefined1 local_478 [32];
  char *pcStack_458;
  uint8_t local_450 [8];
  mpt_message tmp;
  char buf [1024];
  
  local_478._24_8_ = 0;
  pcStack_458 = (char *)0x0;
  local_478._8_8_ = (char *)0x0;
  local_478._16_8_ = (void *)0x0;
  local_450[0] = '\0';
  local_450[1] = '\0';
  local_450[2] = '\0';
  local_450[3] = '\0';
  local_450[4] = '\0';
  local_450[5] = '\0';
  local_450[6] = '\0';
  local_450[7] = '\0';
  tmp.used = msg->used;
  tmp.base = msg->base;
  tmp.cont = msg->cont;
  tmp.clen = msg->clen;
  len = mpt_message_argv(&tmp,sep);
  if ((long)len < 1) {
    iVar2 = -0x10;
  }
  else if (len < 0x400) {
    mpt_message_read(&tmp,len,buf);
    buf[len] = '\0';
    puVar3 = (undefined1 *)memchr(buf,0x3d,len);
    if (puVar3 == (undefined1 *)0x0) {
      iVar2 = -8;
    }
    else {
      *puVar3 = 0;
      local_478._16_8_ = &pcStack_458;
      local_478._24_8_ = 0x73;
      pcStack_458 = puVar3 + 1;
      pcVar4 = buf + (len - (long)pcStack_458);
      local_478._0_8_ = buf;
      if ((buf[0] == '\'') || (buf[0] == '\"')) {
        if (buf[0] == puVar3[(long)pcVar4]) {
          puVar3[(long)pcVar4] = 0;
          local_478._0_8_ = buf + 1;
        }
      }
      else {
        cVar1 = *pcStack_458;
        if (((cVar1 == '\'') || (cVar1 == '\"')) && (cVar1 == puVar3[(long)pcVar4])) {
          puVar3[(long)pcVar4] = 0;
          pcStack_458 = puVar3 + 2;
        }
      }
      iVar2 = (*sfcn)(spar,(mpt_property *)local_478);
      if (iVar2 < 0) {
        iVar2 = -2;
      }
      else {
        msg->cont = tmp.cont;
        msg->clen = tmp.clen;
        msg->used = tmp.used;
        msg->base = tmp.base;
      }
    }
  }
  else {
    iVar2 = -0x11;
  }
  return iVar2;
}

Assistant:

extern int mpt_message_property(MPT_STRUCT(message) *msg, int sep, MPT_TYPE(property_handler) sfcn, void *spar)
{
	MPT_STRUCT(message) tmp;
	MPT_STRUCT(property) prop = MPT_PROPERTY_INIT;
	char buf[1024], *pos;
	ssize_t part, len;
	
	tmp = *msg;
	if ((part = mpt_message_argv(&tmp, sep)) <= 0) {
		return MPT_ERROR(MissingData);
	}
	if (part >= (ssize_t) sizeof(buf)) {
		return MPT_ERROR(MissingBuffer);
	}
	mpt_message_read(&tmp, part, buf);
	buf[part] = '\0';
	
	if (!(pos = memchr(buf, '=', part))) {
		return MPT_ERROR(BadEncoding);
	}
	*pos = 0;
	
	prop.name = buf;
	MPT_property_set_string(&prop, ++pos);
	
	len = part - (pos - buf);
	
	if (*buf == '\'' || *buf == '"') {
		if (*buf == pos[len - 1]) {
			pos[len - 1] = '\0';
			++prop.name;
		}
	}
	else if (*pos == '\'' || *pos == '"') {
		if (*pos == pos[len - 1]) {
			pos[len - 1] = '\0';
			MPT_property_set_string(&prop, ++pos);
		}
	}
	if ((part = sfcn(spar, &prop)) < 0) {
		return MPT_ERROR(BadValue);
	}
	*msg = tmp;
	return part;
}